

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCoordsys.h
# Opt level: O3

ChCoordsys<double> * __thiscall
chrono::ChCoordsys<double>::TransformLocalToParent
          (ChCoordsys<double> *__return_storage_ptr__,ChCoordsys<double> *this,
          ChCoordsys<double> *local)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  double local_38;
  double dStack_30;
  double local_28;
  
  TransformLocalToParent(this,&local->pos);
  dVar1 = (this->rot).m_data[1];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1;
  auVar3 = *(undefined1 (*) [16])((this->rot).m_data + 2);
  dVar2 = (this->rot).m_data[0];
  auVar13._8_8_ = dVar2;
  auVar13._0_8_ = dVar2;
  auVar13._16_8_ = dVar2;
  auVar13._24_8_ = dVar2;
  dVar2 = (this->rot).m_data[3];
  auVar12._24_8_ = dVar2;
  auVar12._16_8_ = dVar2;
  (__return_storage_ptr__->pos).m_data[0] = local_38;
  (__return_storage_ptr__->pos).m_data[1] = dStack_30;
  auVar10._0_8_ = -dVar1;
  auVar10._8_8_ = 0x8000000000000000;
  auVar8._0_8_ = -auVar3._0_8_;
  auVar8._8_8_ = -auVar3._8_8_;
  auVar6 = vunpcklpd_avx(auVar10,auVar6);
  auVar7._16_16_ = auVar3;
  auVar7._0_16_ = auVar6;
  (__return_storage_ptr__->pos).m_data[2] = local_28;
  auVar9 = *(undefined1 (*) [32])(local->rot).m_data;
  auVar4 = vpermpd_avx2(auVar9,1);
  auVar5 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])((local->rot).m_data + 2)),0x15);
  auVar11._0_8_ = auVar4._0_8_ * auVar6._0_8_;
  auVar11._8_8_ = auVar4._8_8_ * auVar6._8_8_;
  auVar11._16_8_ = auVar4._16_8_ * auVar3._0_8_;
  auVar11._24_8_ = auVar4._24_8_ * auVar3._8_8_;
  dVar1 = (local->rot).m_data[1];
  auVar14._24_8_ = dVar1;
  auVar14._16_8_ = dVar1;
  auVar4 = vpermpd_avx2(auVar7,0x66);
  auVar3 = vfmadd231pd_fma(auVar11,auVar9,auVar13);
  dVar1 = (local->rot).m_data[2];
  auVar14._8_8_ = dVar1;
  auVar14._0_8_ = dVar1;
  auVar12._0_16_ = auVar8;
  auVar9._16_16_ = auVar10;
  auVar9._0_16_ = auVar8;
  auVar9 = vshufpd_avx(auVar9,auVar4,9);
  auVar4 = vpermpd_avx2(auVar12,0x24);
  auVar3 = vfmadd213pd_fma(auVar14,auVar4,ZEXT1632(auVar3));
  auVar3 = vfmadd213pd_fma(auVar9,auVar5,ZEXT1632(auVar3));
  *(undefined1 (*) [32])(__return_storage_ptr__->rot).m_data = ZEXT1632(auVar3);
  return __return_storage_ptr__;
}

Assistant:

ChCoordsys<Real> TransformLocalToParent(const ChCoordsys<Real>& local) const {
        return ChCoordsys<Real>(TransformLocalToParent(local.pos), rot % local.rot);
    }